

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

ostream * operator<<(ostream *out,pair<double,_double> *pair)

{
  ostream *poVar1;
  pair<double,_double> *pair_local;
  ostream *out_local;
  
  poVar1 = std::operator<<(out,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pair->first);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pair->second);
  poVar1 = std::operator<<(poVar1,"]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const std::pair<U, V> &pair)
{
    out << "[" << pair.first << ", " << pair.second << "]" << std::endl;
    return out;
}